

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *callback,void *userData)

{
  int iVar1;
  char *pcVar2;
  unsigned_long uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PaUtilHostBufferSizeMode local_bc;
  double dStack_b8;
  PaUtilHostBufferSizeMode hostBufferSizeMode;
  PaTime outputLatency;
  PaTime inputLatency;
  int numOutputChannels;
  int numInputChannels;
  PaSampleFormat outputSampleFormat;
  PaSampleFormat inputSampleFormat;
  PaSampleFormat hostOutputSampleFormat;
  PaSampleFormat hostInputSampleFormat;
  PaAlsaStream *stream;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaStreamFlags PStack_68;
  PaError result;
  PaStreamFlags streamFlags_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  PaStream **s_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  alsaHostApi._4_4_ = 0;
  hostInputSampleFormat = 0;
  hostOutputSampleFormat = 0;
  inputSampleFormat = 0;
  outputSampleFormat = 0;
  _numOutputChannels = 0;
  inputLatency._4_4_ = 0;
  inputLatency._0_4_ = 0;
  local_bc = paUtilFixedHostBufferSize;
  if ((streamFlags & 0xffff0000) != 0) {
    return -0x270b;
  }
  stream = (PaAlsaStream *)hostApi;
  PStack_68 = streamFlags;
  streamFlags_local = framesPerBuffer;
  framesPerBuffer_local = (unsigned_long)sampleRate;
  sampleRate_local = (double)outputParameters;
  outputParameters_local = inputParameters;
  inputParameters_local = (PaStreamParameters *)s;
  s_local = (PaStream **)hostApi;
  if (inputParameters != (PaStreamParameters *)0x0) {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2813\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
      goto LAB_00109bb8;
    }
    inputLatency._4_4_ = outputParameters_local->channelCount;
    outputSampleFormat = outputParameters_local->sampleFormat;
  }
  if (sampleRate_local != 0.0) {
    paUtilErr_ = ValidateParameters((PaStreamParameters *)sampleRate_local,
                                    (PaUtilHostApiRepresentation *)s_local,StreamDirection_Out);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2820\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
      goto LAB_00109bb8;
    }
    inputLatency._0_4_ = *(int *)((long)sampleRate_local + 4);
    _numOutputChannels = *(PaSampleFormat *)((long)sampleRate_local + 8);
  }
  if ((streamFlags_local == 0) && (pcVar2 = getenv("PA_ALSA_PERIODSIZE"), pcVar2 != (char *)0x0)) {
    pcVar2 = getenv("PA_ALSA_PERIODSIZE");
    iVar1 = atoi(pcVar2);
    streamFlags_local = (PaStreamFlags)iVar1;
  }
  hostInputSampleFormat = (PaSampleFormat)PaUtil_AllocateMemory(0x388);
  if ((PaAlsaStream *)hostInputSampleFormat == (PaAlsaStream *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2833\n"
                     );
    alsaHostApi._4_4_ = -0x2708;
  }
  else {
    paUtilErr_ = PaAlsaStream_Initialize
                           ((PaAlsaStream *)hostInputSampleFormat,
                            (PaAlsaHostApiRepresentation *)stream,outputParameters_local,
                            (PaStreamParameters *)sampleRate_local,(double)framesPerBuffer_local,
                            streamFlags_local,callback,PStack_68,userData);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate, framesPerBuffer, callback, streamFlags, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2835\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
    }
    else {
      paUtilErr_ = PaAlsaStream_Configure
                             ((PaAlsaStream *)hostInputSampleFormat,outputParameters_local,
                              (PaStreamParameters *)sampleRate_local,(double)framesPerBuffer_local,
                              streamFlags_local,&outputLatency,&stack0xffffffffffffff48,&local_bc);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer, &inputLatency, &outputLatency, &hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2838\n"
                         );
        alsaHostApi._4_4_ = paUtilErr_;
      }
      else {
        uVar4 = 0;
        if (*(int *)(hostInputSampleFormat + 0x29c) == 0) {
          uVar4 = 0x80000000;
        }
        hostOutputSampleFormat = *(ulong *)(hostInputSampleFormat + 0x288) | uVar4;
        uVar4 = 0;
        if (*(int *)(hostInputSampleFormat + 0x31c) == 0) {
          uVar4 = 0x80000000;
        }
        inputSampleFormat = *(ulong *)(hostInputSampleFormat + 0x308) | uVar4;
        paUtilErr_ = PaUtil_InitializeBufferProcessor
                               ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68),
                                inputLatency._4_4_,outputSampleFormat,hostOutputSampleFormat,
                                inputLatency._0_4_,_numOutputChannels,inputSampleFormat,
                                (double)framesPerBuffer_local,PStack_68,streamFlags_local,
                                *(unsigned_long *)(hostInputSampleFormat + 0x218),local_bc,callback,
                                userData);
        if (-1 < paUtilErr_) {
          if (0 < inputLatency._4_4_) {
            uVar3 = PaUtil_GetBufferProcessorInputLatencyFrames
                              ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68));
            auVar5._8_4_ = (int)(uVar3 >> 0x20);
            auVar5._0_8_ = uVar3;
            auVar5._12_4_ = 0x45300000;
            *(double *)(hostInputSampleFormat + 0x38) =
                 outputLatency +
                 ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (double)framesPerBuffer_local;
          }
          if (0 < inputLatency._0_4_) {
            uVar3 = PaUtil_GetBufferProcessorOutputLatencyFrames
                              ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68));
            auVar6._8_4_ = (int)(uVar3 >> 0x20);
            auVar6._0_8_ = uVar3;
            auVar6._12_4_ = 0x45300000;
            *(double *)(hostInputSampleFormat + 0x40) =
                 dStack_b8 +
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (double)framesPerBuffer_local;
          }
          inputParameters_local->device = (undefined4)hostInputSampleFormat;
          inputParameters_local->channelCount = hostInputSampleFormat._4_4_;
          return alsaHostApi._4_4_;
        }
        PaUtil_DebugPrint(
                         "Expression \'PaUtil_InitializeBufferProcessor( &stream->bufferProcessor, numInputChannels, inputSampleFormat, hostInputSampleFormat, numOutputChannels, outputSampleFormat, hostOutputSampleFormat, sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer, hostBufferSizeMode, callback, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2846\n"
                         );
        alsaHostApi._4_4_ = paUtilErr_;
      }
    }
  }
LAB_00109bb8:
  if (hostInputSampleFormat != 0) {
    PaAlsaStream_Terminate((PaAlsaStream *)hostInputSampleFormat);
  }
  return alsaHostApi._4_4_;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback* callback,
                           void *userData )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaAlsaStream *stream = NULL;
    PaSampleFormat hostInputSampleFormat = 0, hostOutputSampleFormat = 0;
    PaSampleFormat inputSampleFormat = 0, outputSampleFormat = 0;
    int numInputChannels = 0, numOutputChannels = 0;
    PaTime inputLatency, outputLatency;
    /* Operate with fixed host buffer size by default, since other modes will invariably lead to block adaption */
    /* XXX: Use Bounded by default? Output tends to get stuttery with Fixed ... */
    PaUtilHostBufferSizeMode hostBufferSizeMode = paUtilFixedHostBufferSize;

    if( ( streamFlags & paPlatformSpecificFlags ) != 0 )
        return paInvalidFlag;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        numInputChannels = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }
    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        numOutputChannels = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    /* XXX: Why do we support this anyway? */
    if( framesPerBuffer == paFramesPerBufferUnspecified && getenv( "PA_ALSA_PERIODSIZE" ) != NULL )
    {
        PA_DEBUG(( "%s: Getting framesPerBuffer (Alsa period-size) from environment\n", __FUNCTION__ ));
        framesPerBuffer = atoi( getenv("PA_ALSA_PERIODSIZE") );
    }

    PA_UNLESS( stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) ), paInsufficientMemory );
    PA_ENSURE( PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate,
                framesPerBuffer, callback, streamFlags, userData ) );

    PA_ENSURE( PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer,
                &inputLatency, &outputLatency, &hostBufferSizeMode ) );
    hostInputSampleFormat = stream->capture.hostSampleFormat | (!stream->capture.hostInterleaved ? paNonInterleaved : 0);
    hostOutputSampleFormat = stream->playback.hostSampleFormat | (!stream->playback.hostInterleaved ? paNonInterleaved : 0);

    PA_ENSURE( PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
                    numInputChannels, inputSampleFormat, hostInputSampleFormat,
                    numOutputChannels, outputSampleFormat, hostOutputSampleFormat,
                    sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer,
                    hostBufferSizeMode, callback, userData ) );

    /* Ok, buffer processor is initialized, now we can deduce it's latency */
    if( numInputChannels > 0 )
        stream->streamRepresentation.streamInfo.inputLatency = inputLatency + (PaTime)(
                PaUtil_GetBufferProcessorInputLatencyFrames( &stream->bufferProcessor ) / sampleRate);
    if( numOutputChannels > 0 )
        stream->streamRepresentation.streamInfo.outputLatency = outputLatency + (PaTime)(
                PaUtil_GetBufferProcessorOutputLatencyFrames( &stream->bufferProcessor ) / sampleRate);

    PA_DEBUG(( "%s: Stream: framesPerBuffer = %lu, maxFramesPerHostBuffer = %lu, latency i=%f, o=%f\n", __FUNCTION__, framesPerBuffer, stream->maxFramesPerHostBuffer, stream->streamRepresentation.streamInfo.inputLatency, stream->streamRepresentation.streamInfo.outputLatency));

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
    {
        PA_DEBUG(( "%s: Stream in error, terminating\n", __FUNCTION__ ));
        PaAlsaStream_Terminate( stream );
    }

    return result;
}